

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::wrap_mode(Fl_Text_Display *this,int wrap,int wrapMargin)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Fl_Text_Buffer *pFVar6;
  double dVar7;
  int wrapMargin_local;
  int wrap_local;
  Fl_Text_Display *this_local;
  
  switch(wrap) {
  case 0:
    this->mWrapMarginPix = 0;
    this->mContinuousWrap = 0;
    break;
  case 1:
  default:
    dVar7 = col_to_x(this,(double)wrapMargin);
    this->mWrapMarginPix = (int)dVar7;
    this->mContinuousWrap = 1;
    break;
  case 2:
    this->mWrapMarginPix = wrapMargin;
    this->mContinuousWrap = 1;
    break;
  case 3:
    this->mWrapMarginPix = 0;
    this->mContinuousWrap = 1;
  }
  pFVar6 = buffer(this);
  if (pFVar6 == (Fl_Text_Buffer *)0x0) {
    this->mNBufferLines = 0;
    this->mFirstChar = 0;
    this->mTopLineNum = 1;
    this->mAbsTopLineNum = 1;
  }
  else {
    pFVar6 = buffer(this);
    iVar1 = Fl_Text_Buffer::length(pFVar6);
    iVar1 = count_lines(this,0,iVar1,true);
    this->mNBufferLines = iVar1;
    iVar1 = line_start(this,this->mFirstChar);
    this->mFirstChar = iVar1;
    iVar1 = count_lines(this,0,this->mFirstChar,true);
    this->mTopLineNum = iVar1 + 1;
    reset_absolute_top_line_number(this);
    calc_line_starts(this,0,this->mNVisibleLines);
    calc_last_char(this);
  }
  uVar2 = Fl_Widget::x((Fl_Widget *)this);
  uVar3 = Fl_Widget::y((Fl_Widget *)this);
  uVar4 = Fl_Widget::w((Fl_Widget *)this);
  uVar5 = Fl_Widget::h((Fl_Widget *)this);
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  return;
}

Assistant:

void Fl_Text_Display::wrap_mode(int wrap, int wrapMargin) {
  switch (wrap) {
    case WRAP_NONE:
      mWrapMarginPix = 0;
      mContinuousWrap = 0;
      break;
    case WRAP_AT_COLUMN:
    default:
      mWrapMarginPix = int(col_to_x(wrapMargin));
      mContinuousWrap = 1;
      break;
    case WRAP_AT_PIXEL:
      mWrapMarginPix = wrapMargin;
      mContinuousWrap = 1;
      break;
    case WRAP_AT_BOUNDS:
      mWrapMarginPix = 0;
      mContinuousWrap = 1;
      break;
  }

  if (buffer()) {
    /* wrapping can change the total number of lines, re-count */
    mNBufferLines = count_lines(0, buffer()->length(), true);

    /* changing wrap margins or changing from wrapped mode to non-wrapped
     can leave the character at the top no longer at a line start, and/or
     change the line number */
    mFirstChar = line_start(mFirstChar);
    mTopLineNum = count_lines(0, mFirstChar, true) + 1;

    reset_absolute_top_line_number();

    /* update the line starts array */
    calc_line_starts(0, mNVisibleLines);
    calc_last_char();
  } else {
    // No buffer, so just clear the state info for later...
    mNBufferLines  = 0;
    mFirstChar     = 0;
    mTopLineNum    = 1;
    mAbsTopLineNum = 1;		// changed from 0 to 1 -- LZA / STR#2621
  }

  resize(x(), y(), w(), h());
}